

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

MinBroadcastableLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_minbroadcastable(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x366) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x366;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    MinBroadcastableLayerParams::MinBroadcastableLayerParams(this_00.minbroadcastable_);
    (this->layer_).minbroadcastable_ = (MinBroadcastableLayerParams *)this_00;
  }
  return (MinBroadcastableLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::MinBroadcastableLayerParams* NeuralNetworkLayer::mutable_minbroadcastable() {
  if (!has_minbroadcastable()) {
    clear_layer();
    set_has_minbroadcastable();
    layer_.minbroadcastable_ = new ::CoreML::Specification::MinBroadcastableLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.minBroadcastable)
  return layer_.minbroadcastable_;
}